

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O1

int read_record(FILE *fp,int fields_number,char ***record_values)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  size_t i;
  long lVar12;
  ulong uVar13;
  long lVar14;
  char record [10000];
  char r_field [10000];
  int local_4e60;
  char local_4e58 [10000];
  char local_2748 [10008];
  
  if (fp != (FILE *)0x0 && -1 < fields_number) {
    uVar13 = (ulong)(uint)fields_number;
    memset(local_2748,0,10000);
    ppcVar4 = (char **)malloc(uVar13 * 8);
    *record_values = ppcVar4;
    if (ppcVar4 == (char **)0x0) {
      return -1;
    }
    if (fields_number != 0) {
      uVar9 = 0;
      do {
        pcVar5 = strdup("");
        (*record_values)[uVar9] = pcVar5;
        uVar9 = uVar9 + 1;
      } while (uVar13 != uVar9);
    }
    pcVar5 = fgets(local_4e58,10000,(FILE *)fp);
    if (pcVar5 == (char *)0x0) {
      ppcVar4 = *record_values;
      if (ppcVar4 == (char **)0x0) goto LAB_00118d85;
      if (fields_number != 0) {
        uVar9 = 0;
        do {
          free(ppcVar4[uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar13 != uVar9);
      }
    }
    else {
      sVar6 = strlen(local_4e58);
      sVar7 = strlen(local_4e58);
      (local_4e58 + sVar7)[0] = '\n';
      (local_4e58 + sVar7)[1] = '\0';
      iVar10 = 0;
      uVar13 = 0;
      while( true ) {
        iVar8 = 0;
        bVar3 = false;
        while( true ) {
          while( true ) {
            bVar2 = bVar3;
            iVar11 = (int)uVar13;
            lVar12 = (long)iVar11;
            cVar1 = local_4e58[lVar12];
            uVar13 = lVar12 + 1;
            if (cVar1 != '\"') break;
            bVar3 = true;
            if (bVar2) {
              local_4e60 = (int)sVar6;
              bVar3 = false;
              if (((int)uVar13 < local_4e60) && (local_4e58[lVar12 + 1] == '\"')) {
                lVar12 = (long)iVar8;
                iVar8 = iVar8 + 1;
                local_2748[lVar12] = '\"';
                uVar13 = (ulong)(iVar11 + 2);
                bVar3 = true;
              }
            }
          }
          if (cVar1 == '\0') {
            return 1;
          }
          if ((iVar10 < fields_number && !bVar2) && (cVar1 == '\n' || cVar1 == ',')) break;
          bVar3 = bVar2;
          if ((cVar1 != '\n') && (cVar1 != '\r')) {
            lVar12 = (long)iVar8;
            iVar8 = iVar8 + 1;
            local_2748[lVar12] = cVar1;
          }
        }
        lVar12 = (long)iVar10;
        free((*record_values)[lVar12]);
        pcVar5 = strdup(local_2748);
        (*record_values)[lVar12] = pcVar5;
        ppcVar4 = *record_values;
        if (ppcVar4[lVar12] == (char *)0x0) break;
        memset(local_2748,0,10000);
        iVar10 = iVar10 + 1;
      }
      if (ppcVar4 == (char **)0x0) goto LAB_00118d85;
      if (0 < iVar10) {
        lVar14 = 0;
        do {
          free(ppcVar4[lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar12 != lVar14);
      }
    }
    free(ppcVar4);
  }
LAB_00118d85:
  *record_values = (char **)0x0;
  return -1;
}

Assistant:

int read_record(FILE *fp, const int fields_number, char ***record_values) {
    char record[LINE_MAX_LEN];
    char r_field[LINE_MAX_LEN];
    int r_field_index = 0;
    int r_field_len = 0;
    int in_quotes = 0;  // to ignore commas in "dbl_quoted" field values

    if (fields_number < 0) {
        *record_values = NULL;
        return -1;
    }

    if (fp == NULL) {
        *record_values = NULL;
        return -1;
    }

    memset(r_field, 0, LINE_MAX_LEN);

    *record_values = malloc(fields_number * sizeof(char *));
    if (*record_values == NULL) {
        return -1;
    }
    for (unsigned i = 0; i < fields_number; i++)
        (*record_values)[i] = strdup("");

    if (!fgets(record, LINE_MAX_LEN, fp)) {
        free_cstr_arr(*record_values, fields_number);
        *record_values = NULL;
        return -1;
    }

    char chr;
    int chr_pos = 0;
    int record_len = strlen(record);  // In theory, is guaranteed to have null-terminator, as
                                      // fgets() automatically applies one.
                                      // If not, pls PR or drop maintainer(s) a line.

    strcat(record, "\n");  // fixes the error that happens when the last record isn't followed by a newline
                           // (then the last record field fails to be parsed)

    while ((chr = record[++chr_pos - 1])) {
        if (chr == '"') {
            if (in_quotes == 0) {
                in_quotes = 1;
            } else {
                if (chr_pos < record_len && record[chr_pos] == '"') {
                    r_field[++r_field_len - 1] = '"';
                    chr_pos++;
                } else {
                    in_quotes = 0;
                }
            }
        } else if ((chr == ',' || chr == '\n') && !in_quotes && r_field_index < fields_number) {
            free((*record_values)[r_field_index]);
            (*record_values)[r_field_index] = strdup(r_field);

            if ((*record_values)[r_field_index] == NULL) {
                free_cstr_arr(*record_values, r_field_index);
                *record_values = NULL;
                return -1;
            }

            memset(r_field, 0, LINE_MAX_LEN);
            r_field_len = 0;
            r_field_index++;
        } else if (chr != '\n' && chr != '\r') {
            r_field[++r_field_len - 1] = chr;
        }
    }
    return 1;
}